

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               (string *filename,vector<unsigned_long,_std::allocator<unsigned_long>_> *homology,
               string *out_filename)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  pointer poVar4;
  size_type sVar5;
  size_type __val;
  reference pvVar6;
  reference puVar7;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *this;
  flagser_parameters *in_RDX;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_RSI;
  char *pcVar8;
  string *in_RDI;
  unsigned_long b_1;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  unsigned_long b;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  unsigned_long i;
  bool correct;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  result;
  directed_flag_complex_in_memory_computer_t complex;
  unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
  output;
  unsigned_short min_dimension;
  unsigned_short max_dimension;
  coefficient_t modulus;
  size_t max_entries;
  filtered_directed_graph_t graph;
  flagser_parameters params;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_fffffffffffffb08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffb10;
  ostream *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_fffffffffffffb30;
  value_type vVar9;
  directed_flag_complex_in_memory_computer_t *in_stack_fffffffffffffb38;
  value_type vVar10;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_fffffffffffffb40;
  ulong uVar11;
  allocator *paVar12;
  string local_470 [32];
  flagser_parameters *in_stack_fffffffffffffbb0;
  filtered_directed_graph_t *in_stack_fffffffffffffbb8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbc0;
  flagser_parameters *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  string local_418 [32];
  unsigned_long local_3f8;
  unsigned_long *local_3f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e8 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3d8;
  ulong local_3c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3b8;
  byte local_399;
  undefined1 local_2c0 [194];
  undefined2 local_1fe;
  unsigned_short local_1fc;
  undefined2 local_1fa;
  unsigned_long local_1f8;
  allocator local_1e9;
  string local_1e8 [277];
  undefined1 local_d3;
  string local_a0 [32];
  string local_80 [120];
  string *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,local_8);
  poVar2 = std::operator<<(poVar2,"...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  flagser_parameters::flagser_parameters((flagser_parameters *)in_stack_fffffffffffffbc0._M_current)
  ;
  lVar3 = std::__cxx11::string::size();
  pcVar8 = "barcode";
  if (lVar3 == 0) {
    pcVar8 = "none";
  }
  std::__cxx11::string::operator=(local_80,pcVar8);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    std::__cxx11::string::operator=(local_a0,(string *)in_RDX);
  }
  local_d3 = 1;
  pcVar8 = (char *)std::__cxx11::string::c_str();
  paVar12 = &local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,pcVar8,paVar12);
  read_filtered_directed_graph(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_1f8 = std::numeric_limits<unsigned_long>::max();
  local_1fa = 2;
  local_1fc = std::numeric_limits<unsigned_short>::max();
  local_1fe = 0;
  get_output<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            (in_RDX);
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  directed_flag_complex_in_memory_computer_t
            ((directed_flag_complex_in_memory_computer_t *)in_stack_fffffffffffffbc0._M_current,
             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  poVar4 = std::
           unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
           ::operator->((unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                         *)0x1b40ef);
  (*poVar4->_vptr_output_t[2])(poVar4,local_2c0);
  std::
  unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
  ::get((unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
         *)in_stack_fffffffffffffb10);
  std::numeric_limits<float>::max();
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::persistence_computer_t
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb28,(int)((ulong)in_stack_fffffffffffffb20 >> 0x20),
             SUB84(in_stack_fffffffffffffb20,0));
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::compute_persistence
            (in_RSI,(unsigned_short)((ulong)paVar12 >> 0x30),
             (unsigned_short)((ulong)paVar12 >> 0x20),SUB81((ulong)paVar12 >> 0x18,0));
  local_399 = 1;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::get_betti_numbers(in_stack_fffffffffffffb08);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_3b8);
  __val = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb20);
  if (sVar5 == __val) {
    local_3c0 = 0;
    while (uVar11 = local_3c0,
          sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI),
          uVar11 < sVar5) {
      persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
      ::get_betti_numbers(in_stack_fffffffffffffb08);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_3d8,local_3c0);
      vVar10 = *pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,local_3c0)
      ;
      vVar9 = *pvVar6;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb20)
      ;
      if (vVar10 != vVar9) {
        local_399 = 0;
        break;
      }
      local_3c0 = local_3c0 + 1;
    }
  }
  else {
    local_399 = 0;
  }
  if ((local_399 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Expected betti numbers: ");
    local_3e8[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffb08);
    local_3f0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffb08);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffb10,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffb08), bVar1) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_3e8);
      local_3f8 = *puVar7;
      std::__cxx11::to_string(__val);
      poVar2 = std::operator<<((ostream *)&std::cout,local_418);
      std::operator<<(poVar2," ");
      std::__cxx11::string::~string(local_418);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(local_3e8);
    }
    std::operator<<((ostream *)&std::cout,"; computed: ");
    persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
    ::get_betti_numbers(in_stack_fffffffffffffb08);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb08);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb08);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffb10,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffb08), bVar1) {
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)&stack0xfffffffffffffbc0);
      std::__cxx11::to_string(__val);
      in_stack_fffffffffffffb20 = std::operator<<((ostream *)&std::cout,local_470);
      std::operator<<(in_stack_fffffffffffffb20," ");
      std::__cxx11::string::~string(local_470);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&stack0xfffffffffffffbc0);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb20);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"FAILED");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  this = (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
          *)std::operator<<((ostream *)&std::cout,"All good.");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::~persistence_computer_t(this);
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  ~directed_flag_complex_in_memory_computer_t((directed_flag_complex_in_memory_computer_t *)this);
  std::
  unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
  ::~unique_ptr((unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                 *)in_stack_fffffffffffffb20);
  filtered_directed_graph_t::~filtered_directed_graph_t((filtered_directed_graph_t *)this);
  flagser_parameters::~flagser_parameters((flagser_parameters *)this);
  return;
}

Assistant:

void compute(std::string&& filename, std::vector<size_t> homology, std::string out_filename = "") {
	std::cout << "Testing " << filename << "..." << std::endl;
	flagser_parameters params;
	params.output_format = out_filename.size() == 0 ? "none" : "barcode";
	if (out_filename.size() > 0) { params.output_name = out_filename; }
	params.directed = true;
	filtered_directed_graph_t graph = read_filtered_directed_graph(filename.c_str(), params);

	size_t max_entries = std::numeric_limits<size_t>::max();
	coefficient_t modulus = 2;

	unsigned short max_dimension = std::numeric_limits<unsigned short>::max();
	unsigned short min_dimension = 0;

	auto output = get_output<T>(params);
	T complex(graph, params);

	output->set_complex(&complex);

	auto result = persistence_computer_t<decltype(complex)>(complex, output.get(), max_entries, modulus);
	result.compute_persistence(min_dimension, max_dimension);

	bool correct = true;

	if (result.get_betti_numbers().size() != homology.size()) {
		correct = false;
	} else {
		for (auto i = 0ul; i < homology.size(); i++) {
			if (result.get_betti_numbers()[i] != homology[i]) {
				correct = false;
				break;
			}
		}
	}

	if (!correct) {
		std::cout << "Expected betti numbers: ";
		for (auto b : homology) std::cout << std::to_string(b) << " ";
		std::cout << "; computed: ";
		for (auto b : result.get_betti_numbers()) std::cout << std::to_string(b) << " ";
		std::cout << std::endl;
		std::cout << "FAILED" << std::endl;
		//   throw std::logic_error(std::string("Wrong betti numbers computed."));
	}

	std::cout << "All good." << std::endl;
}